

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

int emit_move(Function *fn,Pseudo *src,Pseudo *dst)

{
  TextBuffer *mb;
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  Constant *pCVar4;
  uint uVar5;
  Proc *pPVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  
  uVar5 = *(uint *)dst;
  uVar7 = uVar5 & 0xf;
  if (0xd < uVar7) {
LAB_00122154:
    handle_error_bad_pseudo(fn,dst,"emit_move: Unexpected dst pseudo");
  }
  if ((0x2011U >> uVar7 & 1) == 0) {
    if ((0xcU >> uVar7 & 1) == 0) {
      if (uVar7 != 1) goto LAB_00122154;
      uVar5 = *(uint *)src & 0xf;
      if (uVar5 < 0xe) {
        if ((0x3011U >> uVar5 & 1) != 0) {
          raviX_buffer_add_string(&fn->body,"{\nTValue *reg = ");
          emit_reg_accessor(fn,src,0);
          raviX_buffer_add_string(&fn->body,";\n");
          emit_varname(fn,dst);
          pcVar9 = " = fltvalue(reg);\n}\n";
          goto LAB_00122125;
        }
        if (uVar5 == 1) goto LAB_00121e52;
        if (uVar5 == 5) {
          uVar1 = ((src->field_3).constant)->type;
          if (uVar1 == 8) {
            emit_varname(fn,dst);
            pPVar6 = (src->field_3).proc;
            pcVar9 = " = (lua_Number)%lld;\n";
            goto LAB_0012209f;
          }
          if (uVar1 == 0x10) {
            emit_varname(fn,dst);
            raviX_buffer_add_string(&fn->body," = ");
            raviX_buffer_add_double(&fn->body,(((src->field_3).constant)->field_2).n);
            pcVar9 = ";\n";
            goto LAB_00122125;
          }
          pcVar9 = "emit_move_flttemp: Unexpected src pseudo";
          goto LAB_00122188;
        }
      }
      pcVar9 = "Unexpected src pseudo";
    }
    else {
      uVar5 = *(uint *)src & 0xf;
      if (uVar5 < 0xe) {
        if ((0x3011U >> uVar5 & 1) != 0) {
          raviX_buffer_add_string(&fn->body,"{\nTValue *reg = ");
          emit_reg_accessor(fn,src,0);
          raviX_buffer_add_string(&fn->body,";\n");
          emit_varname(fn,dst);
          pcVar9 = " = ivalue(reg);\n}\n";
          goto LAB_00122125;
        }
        if ((0xcU >> uVar5 & 1) != 0) {
LAB_00121e52:
          emit_varname(fn,dst);
          raviX_buffer_add_string(&fn->body," = ");
          emit_varname(fn,src);
          pcVar9 = ";\n";
          goto LAB_00122125;
        }
        if ((uVar5 == 5) && (((src->field_3).constant)->type == 8)) {
          emit_varname(fn,dst);
          pPVar6 = (src->field_3).proc;
          pcVar9 = " = %lld;\n";
LAB_0012209f:
          raviX_buffer_add_fstring(&fn->body,pcVar9,pPVar6->nodes);
          return 0;
        }
      }
      pcVar9 = "emit_move_inttemp: Unexpected pseudo";
    }
    goto LAB_00122188;
  }
  uVar3 = *(uint *)src;
  uVar8 = uVar3 & 0xf;
  switch((ulong)uVar8) {
  case 0:
  case 4:
  case 0xc:
  case 0xd:
    if ((refers_to_same_register_reg_pseudos[uVar8] == '\x01') &&
       (refers_to_same_register_reg_pseudos[uVar7] == '\x01')) {
      if (uVar7 == 0xd || uVar8 == 0xd) {
        if ((((uVar3 ^ uVar5) & 0xf) == 0) &&
           ((src->field_3).range_in_use == (dst->field_3).range_in_use)) {
          return 0;
        }
      }
      else if ((uVar7 != 0 && uVar8 != 0) ||
              ((((uVar3 ^ uVar5) & 0xf) == 0 &&
               ((((uVar3 | uVar5) & 0xf) != 0 ||
                ((((src->field_3).symbol)->symbol_type == SYM_LOCAL &&
                 (((dst->field_3).symbol)->symbol_type == SYM_LOCAL)))))))) {
        uVar5 = compute_register_from_base(fn,src);
        uVar7 = compute_register_from_base(fn,dst);
        if (uVar5 == uVar7) {
          return 0;
        }
      }
    }
    raviX_buffer_add_string(&fn->body,"{\n const TValue *src_reg = ");
    emit_reg_accessor(fn,src,0);
    raviX_buffer_add_string(&fn->body,";\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    pcVar9 = ";\n dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.n = src_reg->value_.n;\n}\n";
    goto LAB_00122125;
  case 1:
    raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    pcVar9 = ";\n setfltvalue(dst_reg, ";
    break;
  case 2:
    raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    pcVar9 = ";\n setivalue(dst_reg, ";
    break;
  case 3:
    raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    pcVar9 = ";\n setbvalue(dst_reg, ";
    break;
  case 5:
    mb = &fn->body;
    raviX_buffer_add_string(mb,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    raviX_buffer_add_string(mb,";\n");
    pCVar4 = (src->field_3).constant;
    uVar2 = pCVar4->type;
    if (uVar2 < 8) {
      if (uVar2 == 1) {
        pcVar9 = " setnilvalue(dst_reg);\n";
        goto LAB_00122113;
      }
      if (uVar2 != 7) goto switchD_00121ca6_caseD_6;
      raviX_buffer_add_fstring(mb," setbvalue(dst_reg, %i);\n",(ulong)*(uint *)&pCVar4->field_2);
    }
    else {
      if (uVar2 == 0x101) {
        raviX_buffer_add_string(mb," TValue *src_reg = ");
        emit_reg_accessor(fn,src,0);
        raviX_buffer_add_string(mb,";\n");
        pcVar9 = " dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.gc = src_reg->value_.gc;\n";
      }
      else {
        if (uVar2 != 0x10) {
          if (uVar2 == 8) {
            raviX_buffer_add_fstring(mb," setivalue(dst_reg, %lld);\n",(pCVar4->field_2).i);
            goto LAB_0012211b;
          }
          goto switchD_00121ca6_caseD_6;
        }
        raviX_buffer_add_string(mb," setfltvalue(dst_reg, ");
        raviX_buffer_add_double(mb,(((src->field_3).constant)->field_2).n);
        pcVar9 = " );\n";
      }
LAB_00122113:
      raviX_buffer_add_string(mb,pcVar9);
    }
LAB_0012211b:
    pcVar9 = "}\n";
    goto LAB_00122125;
  default:
switchD_00121ca6_caseD_6:
    pcVar9 = "emit_move: Unexpected src pseudo";
LAB_00122188:
    handle_error_bad_pseudo(fn,src,pcVar9);
  case 7:
    raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    pcVar9 = ";\n setnilvalue(dst_reg);\n}\n";
    goto LAB_00122125;
  case 8:
  case 9:
    raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
    emit_reg_accessor(fn,dst,0);
    raviX_buffer_add_fstring
              (&fn->body,";\n setbvalue(dst_reg, %d);\n}\n",
               (ulong)(((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x8));
    return 0;
  }
  raviX_buffer_add_string(&fn->body,pcVar9);
  emit_varname(fn,src);
  pcVar9 = ");\n}\n";
LAB_00122125:
  raviX_buffer_add_string(&fn->body,pcVar9);
  return 0;
}

Assistant:

static int emit_move(Function *fn, Pseudo *src, Pseudo *dst)
{
	if (dst->type == PSEUDO_TEMP_FLT) {
		emit_move_flttemp(fn, src, dst);
	} else if (dst->type == PSEUDO_TEMP_INT || dst->type == PSEUDO_TEMP_BOOL) {
		emit_move_inttemp(fn, src, dst);
	} else if (dst->type == PSEUDO_TEMP_ANY || dst->type == PSEUDO_SYMBOL || dst->type == PSEUDO_LUASTACK) {
		if (src->type == PSEUDO_LUASTACK || src->type == PSEUDO_TEMP_ANY || src->type == PSEUDO_SYMBOL ||
		    src->type == PSEUDO_RANGE_SELECT) {
			// Only emit a move if we are not referencing the same register
			if (!refers_to_same_register(fn, src, dst)) {
				raviX_buffer_add_string(&fn->body, "{\n const TValue *src_reg = ");
				emit_reg_accessor(fn, src, 0);
				raviX_buffer_add_string(&fn->body, ";\n TValue *dst_reg = ");
				emit_reg_accessor(fn, dst, 0);
				// FIXME - check value assignment approach
				raviX_buffer_add_string(
				    &fn->body,
				    ";\n dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.n = src_reg->value_.n;\n}\n");
			}
		} else if (src->type == PSEUDO_TEMP_INT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setivalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_TEMP_FLT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setfltvalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_TRUE || src->type == PSEUDO_FALSE) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_fstring(&fn->body, ";\n setbvalue(dst_reg, %d);\n}\n",
						 src->type == PSEUDO_TRUE ? 1 : 0);
		} else if (src->type == PSEUDO_TEMP_BOOL) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setbvalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_NIL) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setnilvalue(dst_reg);\n}\n");
		} else if (src->type == PSEUDO_CONSTANT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n");
			if (src->constant->type == RAVI_TNUMINT) {
				raviX_buffer_add_fstring(&fn->body, " setivalue(dst_reg, %lld);\n", src->constant->i);
			} else if (src->constant->type == RAVI_TNUMFLT) {
				raviX_buffer_add_string(&fn->body, " setfltvalue(dst_reg, ");
				raviX_buffer_add_double(&fn->body, src->constant->n);
				raviX_buffer_add_string(&fn->body, " );\n");
			} else if (src->constant->type == RAVI_TBOOLEAN) {
				raviX_buffer_add_fstring(&fn->body, " setbvalue(dst_reg, %i);\n",
							 (int)src->constant->i);
			} else if (src->constant->type == RAVI_TNIL) {
				raviX_buffer_add_string(&fn->body, " setnilvalue(dst_reg);\n");
			} else if (src->constant->type == RAVI_TSTRING) {
				raviX_buffer_add_string(&fn->body, " TValue *src_reg = ");
				emit_reg_accessor(fn, src, 0);
				raviX_buffer_add_string(&fn->body, ";\n");
				raviX_buffer_add_string(
				    &fn->body,
				    " dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.gc = src_reg->value_.gc;\n");
			} else {
				handle_error_bad_pseudo(fn, src, "emit_move: Unexpected src pseudo");
				return -1;
			}
			raviX_buffer_add_string(&fn->body, "}\n");
		} else {
			/* range pseudos not supported yet */
			handle_error_bad_pseudo(fn, src, "emit_move: Unexpected src pseudo");
			return -1;
		}
	} else {
		handle_error_bad_pseudo(fn, dst, "emit_move: Unexpected dst pseudo");
		return -1;
	}
	return 0;
}